

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab10.c
# Opt level: O2

int CheckerBigTriangle(void)

{
  int j;
  FILE *__stream;
  char *pcVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  TPoint point;
  int found [3];
  TPoint pointOut [3];
  
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    puts("can\'t open out.txt");
    uVar3 = 0xffffffff;
  }
  else {
    pointOut[0].x = -0x80000000;
    pointOut[0].y = -0x80000000;
    pointOut[1].x = 0x7fffffff;
    pointOut[1].y = 0x7fffffff;
    pointOut[2].x = 0x7fffffff;
    pointOut[2].y = 0x7fffffff;
    if (bigTrianglesN == 2) {
      pointOut[2].x = 0x7ffe7961;
      pointOut[2].y = 0x7fffffff;
    }
    else if (bigTrianglesN == 1) {
      pointOut[2].x = 0x7fffffff;
      pointOut[2].y = 0x7ffe7961;
    }
    found[2] = 0;
    found[0] = 0;
    found[1] = 0;
    iVar5 = 0;
    pcVar6 = "FAILED";
    for (iVar4 = 0; iVar4 != 3; iVar4 = iVar4 + 1) {
      point.x = 0;
      point.y = 0;
      pcVar1 = ScanPoint((FILE *)__stream,&point);
      if (pcVar1 == "FAILED") {
        fclose(__stream);
        pcVar6 = "short output -- %s\n";
        goto LAB_00102abb;
      }
      for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
        if ((point.x == pointOut[lVar2].x) && (point.y == pointOut[lVar2].y)) {
          if (found[lVar2] == 1) goto LAB_00102aac;
          found[lVar2] = found[lVar2] + 1;
          iVar5 = iVar5 + 1;
          break;
        }
      }
    }
    if (iVar5 == 3) {
      iVar4 = HaveGarbageAtTheEnd((FILE *)__stream);
      bigTrianglesN = bigTrianglesN + 1;
      fclose(__stream);
      if (iVar4 == 0) {
        pcVar6 = "PASSED";
      }
      puts(pcVar6);
      uVar3 = (uint)(iVar4 != 0);
    }
    else {
LAB_00102aac:
      fclose(__stream);
      pcVar6 = "wrong output -- %s\n";
LAB_00102abb:
      printf(pcVar6,"FAILED");
      uVar3 = 1;
    }
  }
  return uVar3;
}

Assistant:

static int CheckerBigTriangle(void)
{
    FILE *const out = fopen("out.txt", "r");
    if (!out) {
        printf("can't open out.txt\n");
        return -1;
    }

    TPoint pointOut[3] =  { { INT_MIN, INT_MIN }, { INT_MAX, INT_MAX }, { INT_MAX, INT_MAX } };
    if (bigTrianglesN == 1) {
        pointOut[2].y = INT_MAX - MAX_POINT_COUNT + 2;
    }
    else if (bigTrianglesN == 2) {
        pointOut[2].x = INT_MAX - MAX_POINT_COUNT + 2;
    } 

    int found[3] = { 0 };
    int foundCount = 0;
    for (int i = 0; i < 3; ++i) {
        TPoint point = { 0, 0 };
        if (ScanPoint(out, &point) == Fail) {
            fclose(out);
            printf("short output -- %s\n", Fail);
            return 1;
        }

        for (int j = 0; j < 3; ++j) {
            if (point.x == pointOut[j].x && point.y == pointOut[j].y) {
                if (found[j] == 1) {
                    fclose(out);
                    printf("wrong output -- %s\n", Fail);
                    return 1;
                }
                
                ++found[j];
                ++foundCount;
                break;
            }
        }
    }
    
    if (foundCount != 3) {
        fclose(out);
        printf("wrong output -- %s\n", Fail);
        return 1;
    }

    int passed = !HaveGarbageAtTheEnd(out);

    ++bigTrianglesN;
    fclose(out);
    printf("%s\n", (passed) ? Pass : Fail);
    return !passed;
}